

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_shrinking_inodes
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,inode_type_counter_array *expected_shrinking_inode_counts)

{
  bool bVar1;
  char *message;
  array<unsigned_long,_4UL> *container;
  ElementsAreArrayMatcher<unsigned_long> *matcher;
  AssertHelper local_98;
  Message local_90 [3];
  ElementsAreArrayMatcher<unsigned_long> local_78;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_> local_60
  ;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  inode_type_counter_array actual_shrinking_inode_counts;
  inode_type_counter_array *expected_shrinking_inode_counts_local;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_shrinking_inode_counts((inode_type_counter_array *)&gtest_ar.message_,&this->test_db);
  testing::ElementsAreArray<std::array<unsigned_long,4ul>>
            (&local_78,(testing *)expected_shrinking_inode_counts,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
            (&local_60,(internal *)&local_78,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_48,(char *)&local_60,
             (array<unsigned_long,_4UL> *)"(actual_shrinking_inode_counts)");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>::
  ~PredicateFormatterFromMatcher(&local_60);
  testing::internal::ElementsAreArrayMatcher<unsigned_long>::~ElementsAreArrayMatcher(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2d1,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  return;
}

Assistant:

constexpr void assert_shrinking_inodes(
      const inode_type_counter_array &expected_shrinking_inode_counts) {
    const auto actual_shrinking_inode_counts =
        test_db.get_shrinking_inode_counts();
    UNODB_ASSERT_THAT(
        actual_shrinking_inode_counts,
        ::testing::ElementsAreArray(expected_shrinking_inode_counts));
  }